

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlParser.cpp
# Opt level: O3

XMLNode __thiscall
XMLParser::XMLNode::parseString(XMLNode *this,char *lpszXML,char *tag,XMLResults *pResults)

{
  char cVar1;
  undefined *puVar2;
  int iVar3;
  int iVar4;
  XMLError XVar5;
  XMLError XVar6;
  int iVar7;
  char *__s1;
  int iVar8;
  XMLNode xnode;
  XML xml;
  XMLNode local_80;
  XMLNode local_78;
  char *local_70;
  char *local_68;
  undefined8 local_60;
  XMLError local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  if (lpszXML == (char *)0x0) {
    if (pResults != (XMLResults *)0x0) {
      pResults->error = eXMLErrorNoElements;
      pResults->nLine = 0;
      pResults->nColumn = 0;
    }
    XMLNode(this,(XMLNode *)&emptyXMLNode);
    return (XMLNode)(XMLNodeData *)this;
  }
  XMLNode(&local_80,(XMLNodeData *)0x0,(char *)0x0,'\0');
  local_60 = 0;
  local_58 = eXMLErrorNone;
  local_50 = 0;
  local_48 = 0;
  local_40 = 0;
  local_38 = 0x100000000;
  local_70 = lpszXML;
  local_68 = lpszXML;
  ParseXMLElement(&local_80,&local_70);
  XVar6 = local_58;
  if (local_80.d == (XMLNodeData *)0x0) {
    XVar5 = eXMLErrorNoXMLTagFound;
LAB_00199399:
    __s1 = (char *)0x0;
LAB_0019939b:
    XVar6 = XVar5;
    if (((tag != (char *)0x0) && (*tag != '\0')) &&
       ((__s1 == (char *)0x0 || (iVar3 = strcasecmp(__s1,tag), iVar3 != 0)))) {
      getChildNode(&local_78,(char *)&local_80,(int *)tag);
      operator=(&local_80,&local_78);
      ~XMLNode(&local_78);
      if (local_80.d == (XMLNodeData *)0x0) {
        if (pResults != (XMLResults *)0x0) {
          pResults->error = eXMLErrorFirstTagNotFound;
          pResults->nLine = 0;
          pResults->nColumn = 0;
        }
        XMLNode(this,(XMLNode *)&emptyXMLNode);
        goto LAB_001994bd;
      }
    }
  }
  else {
    XVar5 = eXMLErrorNoXMLTagFound;
    if ((local_80.d)->nChild != 0) {
      XVar5 = local_58;
    }
    if (((local_80.d)->nChild == 1) &&
       ((local_80.d)->nAttribute + 1 + (local_80.d)->nText + (local_80.d)->nClear == 1)) {
      XMLNode(&local_78,(local_80.d)->pChild);
      operator=(&local_80,&local_78);
      ~XMLNode(&local_78);
    }
    if (XVar5 < eXMLErrorEmpty) {
      if (local_80.d == (XMLNodeData *)0x0) goto LAB_00199399;
      __s1 = (local_80.d)->lpszName;
      goto LAB_0019939b;
    }
    operator=(&local_80,(XMLNode *)&emptyXMLNode);
  }
  if ((pResults != (XMLResults *)0x0) && (pResults->error = XVar6, XVar6 != eXMLErrorNone)) {
    if (XVar6 == eXMLErrorMissingEndTag) {
      local_60 = CONCAT44(local_60._4_4_,local_60._4_4_);
      iVar3 = local_60._4_4_;
    }
    else {
      iVar3 = (int)local_60;
    }
    if (local_70 == (char *)0x0) {
      __assert_fail("lpXML",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/build_O3/_deps/xmlparser-src/src/xmlParser.cpp"
                    ,0x997,"void XMLParser::CountLinesAndColumns(const char *, int, XMLResults *)");
    }
    pResults->nLine = 1;
    puVar2 = XML_ByteTable;
    pResults->nColumn = 1;
    if (0 < iVar3) {
      iVar4 = 0;
      iVar7 = 1;
      iVar8 = 1;
      do {
        cVar1 = puVar2[(byte)local_70[iVar4]];
        if ((ulong)(byte)local_70[iVar4] == 10) {
          iVar7 = iVar7 + 1;
          pResults->nLine = iVar7;
          iVar8 = 1;
        }
        else {
          iVar8 = iVar8 + 1;
        }
        iVar4 = iVar4 + cVar1;
        pResults->nColumn = iVar8;
      } while (iVar4 < iVar3);
    }
  }
  XMLNode(this,&local_80);
LAB_001994bd:
  ~XMLNode(&local_80);
  return (XMLNode)(XMLNodeData *)this;
}

Assistant:

XMLNode XMLNode::parseString(XMLCSTR lpszXML, XMLCSTR tag, XMLResults * pResults)
    {
        if(!lpszXML)
        {
            if(pResults)
            {
                pResults->error = eXMLErrorNoElements;
                pResults->nLine = 0;
                pResults->nColumn = 0;
            }
            return emptyXMLNode;
        }

        XMLNode xnode(NULL, NULL, FALSE);
        struct XML xml = {lpszXML, lpszXML, 0, 0, eXMLErrorNone, NULL, 0, NULL, 0, TRUE};

        // Create header element
        xnode.ParseXMLElement(&xml);
        enum XMLError error = xml.error;
        if(!xnode.nChildNode())
            error = eXMLErrorNoXMLTagFound;
        if((xnode.nChildNode() == 1) && (xnode.nElement() == 1))
            xnode = xnode.getChildNode();   // skip the empty node

        // If no error occurred
        if((error == eXMLErrorNone) || (error == eXMLErrorMissingEndTag)
           || (error == eXMLErrorNoXMLTagFound))
        {
            XMLCSTR name = xnode.getName();
            if(tag && (*tag) && ((!name) || (xstricmp(name, tag))))
            {
                xnode = xnode.getChildNode(tag);
                if(xnode.isEmpty())
                {
                    if(pResults)
                    {
                        pResults->error = eXMLErrorFirstTagNotFound;
                        pResults->nLine = 0;
                        pResults->nColumn = 0;
                    }
                    return emptyXMLNode;
                }
            }
        }
        else
        {
            // Cleanup: this will destroy all the nodes
            xnode = emptyXMLNode;
        }


        // If we have been given somewhere to place results
        if(pResults)
        {
            pResults->error = error;

            // If we have an error
            if(error != eXMLErrorNone)
            {
                if(error == eXMLErrorMissingEndTag)
                    xml.nIndex = xml.nIndexMissigEndTag;
                // Find which line and column it starts on.
                CountLinesAndColumns(xml.lpXML, xml.nIndex, pResults);
            }
        }
        return xnode;
    }